

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_abstracttx_controller.cpp
# Opt level: O0

void __thiscall
AbstractTransactionController_DefaultConstructorTest_Test::
~AbstractTransactionController_DefaultConstructorTest_Test
          (AbstractTransactionController_DefaultConstructorTest_Test *this)

{
  Test *in_RDI;
  
  testing::Test::~Test(in_RDI);
  return;
}

Assistant:

TEST(AbstractTransactionController, DefaultConstructorTest) {
  // cfd::Initialize();
  const std::string expect_tx_hex = "02000000000000000000";
  TestTransactionController txc = TestTransactionController();
  EXPECT_STREQ(txc.GetHex().c_str(), expect_tx_hex.c_str());
  EXPECT_EQ(txc.GetDefaultSequence(), expect_absttx_default_sequence_num);
  EXPECT_EQ(txc.GetLockTimeDisabledSequence(),
      expect_absttx_default_sequence_num);
}